

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latency_collector.h
# Opt level: O0

void __thiscall LatencyCollector::~LatencyCollector(LatencyCollector *this)

{
  ashared_ptr<MapWrapper>::operator->((ashared_ptr<MapWrapper> *)0x10619c);
  MapWrapper::freeAllItems((MapWrapper *)this);
  ashared_ptr<MapWrapper>::~ashared_ptr((ashared_ptr<MapWrapper> *)0x1061b4);
  return;
}

Assistant:

~LatencyCollector() {
        latestMap->freeAllItems();
    }